

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O3

void __thiscall Assimp::MakeLeftHandedProcess::Execute(MakeLeftHandedProcess *this,aiScene *pScene)

{
  aiAnimation *paVar1;
  uint uVar2;
  Logger *pLVar3;
  ulong uVar4;
  ulong uVar5;
  aiMatrix4x4 local_60;
  
  if (pScene->mRootNode != (aiNode *)0x0) {
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"MakeLeftHandedProcess begin");
    local_60.a1 = 1.0;
    local_60.a2 = 0.0;
    local_60.a3 = 0.0;
    local_60.a4 = 0.0;
    local_60.b1 = 0.0;
    local_60.b2 = 1.0;
    local_60.b3 = 0.0;
    local_60.b4 = 0.0;
    local_60.c1 = 0.0;
    local_60.c2 = 0.0;
    local_60.c3 = 1.0;
    local_60.c4 = 0.0;
    local_60.d1 = 0.0;
    local_60.d2 = 0.0;
    local_60.d3 = 0.0;
    local_60.d4 = 1.0;
    ProcessNode(this,pScene->mRootNode,&local_60);
    if (pScene->mNumMeshes != 0) {
      uVar5 = 0;
      do {
        ProcessMesh(this,pScene->mMeshes[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar5 < pScene->mNumMeshes);
    }
    if (pScene->mNumMaterials != 0) {
      uVar5 = 0;
      do {
        ProcessMaterial(this,pScene->mMaterials[uVar5]);
        uVar5 = uVar5 + 1;
      } while (uVar5 < pScene->mNumMaterials);
    }
    uVar2 = pScene->mNumAnimations;
    if (uVar2 != 0) {
      uVar5 = 0;
      do {
        paVar1 = pScene->mAnimations[uVar5];
        if (paVar1->mNumChannels != 0) {
          uVar4 = 0;
          do {
            ProcessAnimation(this,paVar1->mChannels[uVar4]);
            uVar4 = uVar4 + 1;
          } while (uVar4 < paVar1->mNumChannels);
          uVar2 = pScene->mNumAnimations;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
    pLVar3 = DefaultLogger::get();
    Logger::debug(pLVar3,"MakeLeftHandedProcess finished");
    return;
  }
  __assert_fail("pScene->mRootNode != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/ConvertToLHProcess.cpp"
                ,0x6a,"virtual void Assimp::MakeLeftHandedProcess::Execute(aiScene *)");
}

Assistant:

void MakeLeftHandedProcess::Execute( aiScene* pScene)
{
    // Check for an existent root node to proceed
    ai_assert(pScene->mRootNode != NULL);
    ASSIMP_LOG_DEBUG("MakeLeftHandedProcess begin");

    // recursively convert all the nodes
    ProcessNode( pScene->mRootNode, aiMatrix4x4());

    // process the meshes accordingly
    for ( unsigned int a = 0; a < pScene->mNumMeshes; ++a ) {
        ProcessMesh( pScene->mMeshes[ a ] );
    }

    // process the materials accordingly
    for ( unsigned int a = 0; a < pScene->mNumMaterials; ++a ) {
        ProcessMaterial( pScene->mMaterials[ a ] );
    }

    // transform all animation channels as well
    for( unsigned int a = 0; a < pScene->mNumAnimations; a++)
    {
        aiAnimation* anim = pScene->mAnimations[a];
        for( unsigned int b = 0; b < anim->mNumChannels; b++)
        {
            aiNodeAnim* nodeAnim = anim->mChannels[b];
            ProcessAnimation( nodeAnim);
        }
    }
    ASSIMP_LOG_DEBUG("MakeLeftHandedProcess finished");
}